

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O1

LBDOperator * lts2::CreateLbdOperatorFromYml(string *filename)

{
  char cVar1;
  LBDOperator *pLVar2;
  ostream *poVar3;
  int pheight;
  int pwidth;
  int M;
  int lbdType;
  FileStorage fs;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  FileStorage local_58 [64];
  int local_18;
  int local_14;
  
  local_70 = 0;
  local_68 = 0;
  local_78 = &local_68;
  cv::FileStorage::FileStorage(local_58,(string *)filename,0,(string *)&local_78);
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  cVar1 = cv::FileStorage::isOpened();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Invalid file: ",0xe);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(filename->_M_dataplus)._M_p,
                        filename->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    pLVar2 = (LBDOperator *)0x0;
  }
  else {
    local_7c = 0;
    local_80 = 0x200;
    local_84 = 0x20;
    local_88 = 0x20;
    cv::FileStorage::operator[]((char *)&local_78);
    cv::read((FileNode *)&local_78,&local_7c,0);
    cv::FileStorage::operator[]((char *)&local_78);
    cv::read((FileNode *)&local_78,&local_80,0);
    cv::FileStorage::operator[]((char *)&local_78);
    cv::read((FileNode *)&local_78,&local_84,0);
    cv::FileStorage::operator[]((char *)&local_78);
    cv::read((FileNode *)&local_78,&local_88,0);
    pLVar2 = CreateLbdOperator(local_7c,local_80);
    if (pLVar2 != (LBDOperator *)0x0) {
      local_18 = local_84;
      local_14 = local_88;
      (*(pLVar2->super_LinearOperator)._vptr_LinearOperator[5])(pLVar2);
    }
  }
  cv::FileStorage::~FileStorage(local_58);
  return pLVar2;
}

Assistant:

lts2::LBDOperator *lts2::CreateLbdOperatorFromYml(std::string const &filename)
{
  cv::FileStorage fs(filename, cv::FileStorage::READ);

  if (!fs.isOpened())
  {
    std::cerr << "Invalid file: " << filename << std::endl;
    return NULL;
  }

  LBDOperator *out = NULL;

  int lbdType = 0;
  int M = 512;
  int pwidth = 32;
  int pheight = 32;

  fs["lbd"] >> lbdType;
  fs["measures"] >> M;
  fs["width"] >> pwidth;
  fs["height"] >> pheight;

  out = lts2::CreateLbdOperator(lbdType, M);
  if (out)
  {
    cv::Size patchSize(pwidth, pheight);
    out->initWithPatchSize(patchSize);
  }

  return out;
}